

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::GetSliderChecks<false>(Node *this)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  int score;
  ulong uVar8;
  uint to;
  uint64_t mvs;
  byte bVar9;
  MoveType MVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  Move *this_00;
  ulong uVar16;
  ulong uVar17;
  uint from;
  bool bVar18;
  
  bVar1 = PTR_DAT_0015d338[1];
  if ((bVar1 & 0x88) != 0) {
    __assert_fail("IS_SQUARE(king)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x722,"void clunk::Node::GetSliderChecks() [color = false]");
  }
  if ((undefined *)(&_board)[bVar1] != PTR_DAT_0015d338) {
    __assert_fail("_board[king] == _KING[!color]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x723,"void clunk::Node::GetSliderChecks() [color = false]");
  }
  uVar8 = (&_queenKing)[bVar1];
  if (uVar8 != 0) {
    do {
      if ((uVar8 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x728,"void clunk::Node::GetSliderChecks() [color = false]");
      }
      uVar14 = (int)(uVar8 & 0xff) - 1;
      if ((uVar14 & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x107,"int clunk::Direction(const int, const int)");
      }
      to = (uint)bVar1;
      bVar2 = (&_dir)[(ulong)uVar14 + (ulong)bVar1 * 0x80];
      uVar15 = (uint)(char)bVar2;
      uVar6 = (uint)bVar2;
      if (((0x11 < uVar15) || ((0x38002U >> (uVar15 & 0x1f) & 1) == 0)) &&
         ((0x10 < uVar6 - 0xef || ((0x10007U >> (uVar6 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(dir)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x72b,"void clunk::Node::GetSliderChecks() [color = false]");
      }
      do {
        to = uVar15 + to;
        if ((to & 0xffffff88) != 0) {
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x72d,"void clunk::Node::GetSliderChecks() [color = false]");
        }
        uVar17 = (ulong)to;
        if ((&_dir)[uVar17 + (ulong)bVar1 * 0x80] != bVar2) {
          __assert_fail("Direction(king, to) == dir",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x72e,"void clunk::Node::GetSliderChecks() [color = false]");
        }
        if (*(ulong *)(_atk + uVar17 * 8) != 0) {
          uVar16 = *(ulong *)(_atk + uVar17 * 8);
          do {
            if ((uVar16 & 0xff) == 0) goto LAB_001304b6;
            from = (int)(uVar16 & 0xff) - 1;
            if ((from & 0xffffff88) != 0) {
              __assert_fail("IS_SQUARE(from)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x732,"void clunk::Node::GetSliderChecks() [color = false]");
            }
            uVar12 = (ulong)from;
            if ((char *)(&_board)[uVar12] < _FIRST_SLIDER) {
              __assert_fail("_board[from] >= _FIRST_SLIDER",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x733,"void clunk::Node::GetSliderChecks() [color = false]");
            }
            cVar3 = *(char *)(&_board)[uVar12];
            if (5 < (byte)(cVar3 - 6U)) {
              __assert_fail("IS_SLIDER(_board[from]->type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x734,"void clunk::Node::GetSliderChecks() [color = false]");
            }
            if (cVar3 == '\n') {
              bVar4 = (&_dir)[uVar17 + uVar12 * 0x80];
              if (((0x11 < bVar4) || ((0x38002U >> (bVar4 & 0x1f) & 1) == 0)) &&
                 ((0x10 < bVar4 - 0xef || ((0x10007U >> (bVar4 - 0xef & 0x1f) & 1) == 0)))) {
                __assert_fail("IS_DIR(Direction(from, to))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x759,"void clunk::Node::GetSliderChecks() [color = false]");
              }
              if ((char *)(&_board)[uVar17] == _EMPTY) {
                uVar7 = GetPinDir(this,false,from);
                if ((uVar7 == 0) ||
                   (bVar4 = (&_dir)[uVar17 + uVar12 * 0x80], bVar9 = (char)bVar4 >> 7,
                   uVar7 == (byte)((bVar4 ^ bVar9) - bVar9))) {
                  iVar13 = this->moveCount;
                  lVar11 = (long)iVar13;
                  if (lVar11 < 0) goto LAB_001305f6;
                  if (0x7e < iVar13) goto LAB_001305d7;
                  score = *(int *)(_SQR + uVar17 * 4) - *(int *)(_SQR + uVar12 * 4);
                  this->moveCount = iVar13 + 1;
                  this_00 = this->moves + lVar11;
                  MVar10 = QueenMove;
LAB_00130463:
                  Move::Set(this_00,MVar10,from,to,0,0,score);
                  uVar5 = this->moves[lVar11].bits;
                  iVar13 = 0x32;
                  if (uVar5 != this->killer[1].bits) {
                    iVar13 = 0;
                  }
                  if (uVar5 == this->killer[0].bits) {
                    iVar13 = 0x32;
                  }
                  Move::IncScore(this_00,iVar13);
                }
              }
              else if ((&_dir)[uVar12 + uVar17 * 0x80] == bVar2) {
                cVar3 = *(char *)(&_board)[uVar17];
                if (cVar3 == '\b') {
                  if (bVar2 < 0xef) {
                    if ((bVar2 == 0xf) || (bVar2 == 0x11)) {
LAB_0013021d:
                      mvs = (&_bishopRook)[to | 8];
                      MVar10 = RookMove;
LAB_00130237:
                      GetSliderDiscovers(this,false,MVar10,mvs,to);
                    }
                  }
                  else if ((bVar2 == 0xf1) || (bVar2 == 0xef)) goto LAB_0013021d;
                }
                else if (cVar3 == '\x06') {
                  if (uVar6 < 0xf0) {
                    if ((uVar6 == 1) || (uVar6 == 0x10)) {
LAB_00130158:
                      mvs = (&_bishopRook)[uVar17];
                      MVar10 = BishopMove;
                      goto LAB_00130237;
                    }
                  }
                  else if ((uVar6 == 0xff) || (uVar6 == 0xf0)) goto LAB_00130158;
                }
              }
            }
            else if (cVar3 == '\b') {
              bVar4 = (&_dir)[uVar17 + uVar12 * 0x80];
              if (bVar4 < 0xf0) {
                if ((bVar4 != 1) && (bVar4 != 0x10)) {
LAB_00130672:
                  __assert_fail("IS_CROSS(Direction(from, to))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x748,"void clunk::Node::GetSliderChecks() [color = false]");
                }
              }
              else if ((bVar4 != 0xf0) && (bVar4 != 0xff)) goto LAB_00130672;
              if ((char *)(&_board)[uVar17] == _EMPTY) {
                if (uVar6 < 0xf0) {
                  if ((uVar6 == 1) || (uVar6 == 0x10)) {
LAB_0013033c:
                    uVar7 = GetPinDir(this,false,from);
                    if ((uVar7 == 0) ||
                       (bVar4 = (&_dir)[uVar17 + uVar12 * 0x80], bVar9 = (char)bVar4 >> 7,
                       uVar7 == (byte)((bVar4 ^ bVar9) - bVar9))) {
                      iVar13 = this->moveCount;
                      lVar11 = (long)iVar13;
                      if (lVar11 < 0) {
LAB_001305f6:
                        __assert_fail("moveCount >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                      ,0x60d,
                                      "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                                     );
                      }
                      if (0x7e < iVar13) {
LAB_001305d7:
                        __assert_fail("(moveCount + 1) < MaxMoves",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                      ,0x60e,
                                      "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                                     );
                      }
                      score = *(int *)(_SQR + uVar17 * 4) - *(int *)(_SQR + uVar12 * 4);
                      this->moveCount = iVar13 + 1;
                      this_00 = this->moves + lVar11;
                      MVar10 = RookMove;
                      goto LAB_00130463;
                    }
                  }
                }
                else if ((uVar6 == 0xff) || (uVar6 == 0xf0)) goto LAB_0013033c;
              }
              else if (((&_dir)[uVar12 + uVar17 * 0x80] == bVar2) &&
                      (*(char *)(&_board)[uVar17] == '\x06')) goto LAB_00130158;
            }
            else if (cVar3 == '\x06') {
              bVar4 = (&_dir)[uVar17 + uVar12 * 0x80];
              if (bVar4 < 0xef) {
                if ((bVar4 != 0xf) && (bVar4 != 0x11)) {
LAB_00130653:
                  __assert_fail("IS_DIAG(Direction(from, to))",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                                ,0x737,"void clunk::Node::GetSliderChecks() [color = false]");
                }
              }
              else if ((bVar4 != 0xef) && (bVar4 != 0xf1)) goto LAB_00130653;
              if ((char *)(&_board)[uVar17] == _EMPTY) {
                if (bVar2 < 0xef) {
                  if ((bVar2 == 0xf) || (bVar2 == 0x11)) {
LAB_001303db:
                    uVar7 = GetPinDir(this,false,from);
                    if ((uVar7 == 0) ||
                       (bVar4 = (&_dir)[uVar17 + uVar12 * 0x80], bVar9 = (char)bVar4 >> 7,
                       uVar7 == (byte)((bVar4 ^ bVar9) - bVar9))) {
                      iVar13 = this->moveCount;
                      lVar11 = (long)iVar13;
                      if (lVar11 < 0) goto LAB_001305f6;
                      if (0x7e < iVar13) goto LAB_001305d7;
                      score = *(int *)(_SQR + uVar17 * 4) - *(int *)(_SQR + uVar12 * 4);
                      this->moveCount = iVar13 + 1;
                      this_00 = this->moves + lVar11;
                      MVar10 = BishopMove;
                      goto LAB_00130463;
                    }
                  }
                }
                else if ((bVar2 == 0xf1) || (bVar2 == 0xef)) goto LAB_001303db;
              }
              else if (((&_dir)[uVar12 + uVar17 * 0x80] == bVar2) &&
                      (*(char *)(&_board)[uVar17] == '\b')) goto LAB_0013021d;
            }
LAB_001304b6:
            bVar18 = 0xff < uVar16;
            uVar16 = uVar16 >> 8;
          } while (bVar18);
        }
      } while ((to != uVar14) && ((undefined *)(&_board)[uVar17] == _EMPTY));
      bVar18 = 0xff < uVar8;
      uVar8 = uVar8 >> 8;
    } while (bVar18);
  }
  return;
}

Assistant:

void GetSliderChecks() {
    const int king = _KING[!color]->sqr;
    assert(IS_SQUARE(king));
    assert(_board[king] == _KING[!color]);

    int score;
    int pinDir;
    for (uint64_t mvs = _queenKing[king]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = Direction(king, end);
      assert(IS_DIR(dir));
      for (int to = (king + dir);; to += dir) {
        assert(IS_SQUARE(to));
        assert(Direction(king, to) == dir);
        for (uint64_t tmp = _atk[to]; tmp; tmp >>= 8) {
          if (tmp & 0xFF) {
            const int from = ((tmp & 0xFF) - 1);
            assert(IS_SQUARE(from));
            assert(_board[from] >= _FIRST_SLIDER);
            assert(IS_SLIDER(_board[from]->type));
            switch (_board[from]->type) {
            case (color|Bishop):
              assert(IS_DIAG(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                if (IS_DIAG(dir)) {
                  pinDir = GetPinDir(color, from);
                  if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                    score = (_SQR[to] - _SQR[from]);
                    AddMove(BishopMove, from, to, score);
                  }
                }
              }
              else if ((Direction(to, from) == dir) &
                       (_board[to]->type == (color|Rook)))
              {
                GetSliderDiscovers(color, RookMove, _bishopRook[to + 8], to);
              }
              break;
            case (color|Rook):
              assert(IS_CROSS(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                if (IS_CROSS(dir)) {
                  pinDir = GetPinDir(color, from);
                  if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                    score = (_SQR[to] - _SQR[from]);
                    AddMove(RookMove, from, to, score);
                  }
                }
              }
              else if ((Direction(to, from) == dir) &
                       (_board[to]->type == (color|Bishop)))
              {
                GetSliderDiscovers(color, BishopMove, _bishopRook[to], to);
              }
              break;
            case (color|Queen):
              assert(IS_DIR(Direction(from, to)));
              if (_board[to] == _EMPTY) {
                pinDir = GetPinDir(color, from);
                if (!pinDir || (abs(Direction(from, to)) == pinDir)) {
                  score = (_SQR[to] - _SQR[from]);
                  AddMove(QueenMove, from, to, score);
                }
              }
              else if (Direction(to, from) == dir) {
                switch (_board[to]->type) {
                case (color|Bishop):
                  if (IS_CROSS(dir)) {
                    GetSliderDiscovers(color, BishopMove, _bishopRook[to], to);
                  }
                  break;
                case (color|Rook):
                  if (IS_DIAG(dir)) {
                    GetSliderDiscovers(color, RookMove, _bishopRook[to + 8], to);
                  }
                  break;
                }
              }
              break;
            }
          }
        }
        if ((to == end) | (_board[to] != _EMPTY)) {
          break;
        }
      }
    }
  }